

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O3

void cinemo::wh::printWaveHeader(WaveHeader *wh)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wave Header Information",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File: \t",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(wh->File)._M_dataplus._M_p,(wh->File)._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total size: ",0xc);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Riff Size: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wave ID: ",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(wh->WaveId)._M_dataplus._M_p,
                      (wh->WaveId)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Format Size: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AudioType: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Channels: ",10);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sample Rate: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Hz",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Byte Rate: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bps",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Block Align: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bits per Sample: \t",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Extension Size: \t",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (wh->ExtensionSize != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tExt. Valid Bits Per Sample: ",0x1d);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tExt. Channel Mask: ",0x14);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tGUID: ",7);
    lVar6 = *(long *)(std::cout + -0x18);
    uVar1 = *(undefined4 *)(std::istream::seekg + lVar6);
    if (6 < wh->ExtensionSize) {
      lVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
        lVar2 = *(long *)(std::cout + -0x18);
        if ((&DAT_0010e2d1)[lVar2] == '\0') {
          std::ios::widen((char)lVar2 + -0x10);
          (&DAT_0010e2d1)[lVar2] = 1;
        }
        lVar3 = std::cout;
        id3tag_init[lVar2] = (code)0x30;
        *(undefined8 *)(std::ostream::write + *(long *)(lVar3 + -0x18)) = 2;
        lVar2 = *(long *)(lVar3 + -0x18);
        *(uint *)(std::istream::seekg + lVar2) =
             *(uint *)(std::istream::seekg + lVar2) & 0xffffffb5 | 8;
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,(uint)wh->SubFormat[lVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (long)((ulong)wh->ExtensionSize - 6));
      lVar6 = *(long *)(std::cout + -0x18);
    }
    std::ios::widen((char)lVar6 + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    *(undefined4 *)(std::istream::seekg + *(long *)(std::cout + -0x18)) = uVar1;
  }
  if (wh->HasFact == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FACT Details: ",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tSize: ",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tSample Length: ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (4 < wh->FactSize) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tNote: there is information which have been skipped!",0x34)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Data Size: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Bytes",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Data Begins: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (wh->hasList == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LIST Size: ",0xb);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((wh->WarningFlags).super__Base_bitset<1UL>._M_w != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning Flags: ",0xf);
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             &wh->WarningFlags);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
    std::ostream::put((char)pbVar5);
    std::ostream::flush();
  }
  if ((wh->ErrorFlags).super__Base_bitset<1UL>._M_w != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error Flags: ",0xd);
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             &wh->ErrorFlags);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
    std::ostream::put((char)pbVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void printWaveHeader(const WaveHeader& wh) {

            cout << "-------------------------------------" << endl;
            cout << "Wave Header Information" << endl;
            cout << "File: \t" << wh.File << endl;
            cout << "Total size: " << wh.FileSize << " Bytes" << endl;
            cout << "Riff Size: " << wh.RiffSize << " Bytes" << endl;
            cout << "Wave ID: " << wh.WaveId << endl;
            cout << "Format Size: " << wh.FormatSize << " Bytes" << endl;
            cout << "AudioType: " << wh.FormatAudioType << endl;
            cout << "Channels: " << wh.NumberOfChannels << endl;
            cout << "Sample Rate: " << wh.SampleRate << " Hz" << endl;
            cout << "Byte Rate: " << wh.ByteRate << " Bps" << endl;
            cout << "Block Align: " << wh.BlockAlign << endl;
            cout << "Bits per Sample: \t" << wh.BitsPerSample << endl;
            cout << "Extension Size: \t" << wh.ExtensionSize << endl;
            if (wh.isExtendedFormat()) {
                cout << "\tExt. Valid Bits Per Sample: "
                     << wh.ValidBitsPerSample
                     << endl;
                cout << "\tExt. Channel Mask: " << wh.ChannelMask << endl;
                cout << "\tGUID: ";
                auto flags = cout.flags(); //keep current console flags
                for (int i = 0; i < wh.ExtensionSize - 6; i++) {
                    cout << "0x" << std::setfill('0') << std::setw(2)
                         << std::hex << +wh.SubFormat[i] << " ";
                }
                cout << endl;
                cout.flags(flags);
            }
            if (wh.HasFact) {
                cout << "FACT Details: " << endl;
                cout << "\tSize: " << wh.FactSize << endl;
                cout << "\tSample Length: " << wh.FactSampleLength << " Bytes"
                     << endl;
                if (wh.FactSize > 4) { //standard is 4...but there maybe more
                    cout
                            << "\tNote: there is information which have been skipped!"
                            << endl;
                }
            }
            cout << "Data Size: " << wh.DataSize << " Bytes" << endl;
            cout << "Data Begins: " << wh.DataBegin << endl;
            if (wh.hasList) {
                cout << "LIST Size: " << wh.ListSize << endl;
            }
            if (wh.WarningFlags.any()) {
                cout << "Warning Flags: " << wh.WarningFlags << endl;
            }
            if (wh.ErrorFlags.any()) {
                cout << "Error Flags: " << wh.ErrorFlags << endl;
            }
            cout << "-------------------------------------" << endl;
        }